

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::OutputFile::OutputFile(OutputFile *this,char *fileName,Header *header,int numThreads)

{
  void *pvVar1;
  OStream *os;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *lineOffsets;
  Int64 IVar2;
  Header *in_RDI;
  undefined1 unaff_retaddr;
  OStream *in_stack_00000008;
  Header *in_stack_00000010;
  stringstream _iex_replace_s;
  BaseExc *e;
  undefined1 in_stack_0000188e;
  undefined1 in_stack_0000188f;
  Header *in_stack_00001890;
  OutputStreamMutex *in_stack_fffffffffffffdc0;
  OStream *in_stack_fffffffffffffdc8;
  GenericOutputFile *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffde8;
  StdOFStream *in_stack_fffffffffffffdf0;
  Data *this_00;
  
  GenericOutputFile::GenericOutputFile((GenericOutputFile *)in_RDI);
  *(undefined ***)&(in_RDI->_map)._M_t._M_impl = &PTR__OutputFile_00561ff8;
  this_00 = (Data *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header;
  pvVar1 = operator_new(0x148);
  Data::Data(this_00,(int)((ulong)in_RDI >> 0x20));
  *(void **)&(this_00->header)._map._M_t._M_impl = pvVar1;
  pvVar1 = operator_new(0x38);
  OutputStreamMutex::OutputStreamMutex(in_stack_fffffffffffffdc0);
  *(void **)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x138) = pvVar1
  ;
  *(undefined1 *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x140) = 1
  ;
  Header::sanityCheck(in_stack_00001890,(bool)in_stack_0000188f,(bool)in_stack_0000188e);
  pvVar1 = operator_new(0x38);
  StdOFStream::StdOFStream(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  *(void **)(*(long *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x138
                      ) + 0x28) = pvVar1;
  *(undefined1 *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x38) = 0;
  initialize((OutputFile *)this_00,in_RDI);
  os = (OStream *)
       (**(code **)(**(long **)(*(long *)(*(long *)&(in_RDI->_map)._M_t._M_impl.
                                                    super__Rb_tree_header._M_header + 0x138) + 0x28)
                   + 0x18))();
  *(OStream **)
   (*(long *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x138) + 0x30)
       = os;
  GenericOutputFile::writeMagicNumberAndVersionField
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,(Header *)in_stack_fffffffffffffdc0
            );
  lineOffsets = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                Header::writeTo(in_stack_00000010,in_stack_00000008,(bool)unaff_retaddr);
  *(vector<unsigned_long,_std::allocator<unsigned_long>_> **)
   (*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x40) = lineOffsets;
  IVar2 = anon_unknown_6::writeLineOffsets(os,lineOffsets);
  *(Int64 *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x100) = IVar2;
  return;
}

Assistant:

OutputFile::OutputFile
    (const char fileName[],
     const Header &header,
     int numThreads)
:
    _data (new Data (numThreads))
{
    _data->_streamData=new OutputStreamMutex ();
    _data->_deleteStream=true;
    try
    {
        header.sanityCheck();
        _data->_streamData->os = new StdOFStream (fileName);
        _data->multiPart=false; // only one header, not multipart
        initialize (header);
        _data->_streamData->currentPosition = _data->_streamData->os->tellp();
        
        // Write header and empty offset table to the file.
        writeMagicNumberAndVersionField(*_data->_streamData->os, _data->header);
        _data->previewPosition =
            _data->header.writeTo (*_data->_streamData->os);
        _data->lineOffsetsPosition =
            writeLineOffsets (*_data->_streamData->os,_data->lineOffsets);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        // ~OutputFile will not run, so free memory here
        if (_data)
        {
            if (_data->_streamData)
            {
                delete _data->_streamData->os;
                delete _data->_streamData;
            }

            delete _data;
        }

	REPLACE_EXC (e, "Cannot open image file "
			"\"" << fileName << "\". " << e.what());
	throw;
    }
    catch (...)
    {
        // ~OutputFile will not run, so free memory here
        if (_data)
        {
            if (_data->_streamData)
            {
                delete _data->_streamData->os;
                delete _data->_streamData;
            }
            delete _data;
        }

        throw;
    }
}